

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

string * __thiscall
cmCTestTestHandler::GetTestStatus_abi_cxx11_
          (string *__return_storage_ptr__,cmCTestTestHandler *this,cmCTestTestResult *result)

{
  char *__s;
  allocator<char> local_35 [16];
  allocator<char> local_25;
  int local_24;
  cmCTestTestResult *pcStack_20;
  int status;
  cmCTestTestResult *result_local;
  cmCTestTestHandler *this_local;
  
  local_24 = result->Status;
  pcStack_20 = result;
  result_local = (cmCTestTestResult *)this;
  this_local = (cmCTestTestHandler *)__return_storage_ptr__;
  if ((local_24 < 0) || (9 < local_24)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"No Status",&local_25);
    std::allocator<char>::~allocator(&local_25);
  }
  else if (local_24 == 6) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&result->ExceptionStatus);
  }
  else {
    __s = GetTestStatus::statuses[local_24];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,local_35);
    std::allocator<char>::~allocator(local_35);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestTestHandler::GetTestStatus(cmCTestTestResult const& result)
{
  static const char* statuses[] = { "Not Run",     "Timeout",   "SEGFAULT",
                                    "ILLEGAL",     "INTERRUPT", "NUMERICAL",
                                    "OTHER_FAULT", "Failed",    "BAD_COMMAND",
                                    "Completed" };
  int status = result.Status;
  if (status < cmCTestTestHandler::NOT_RUN ||
      status > cmCTestTestHandler::COMPLETED) {
    return "No Status";
  }
  if (status == cmCTestTestHandler::OTHER_FAULT) {
    return result.ExceptionStatus;
  }
  return statuses[status];
}